

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O2

void __thiscall
Zip::SignatureError::SignatureError(SignatureError *this,uint32_t expected,uint32_t actual)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  stringstream ss;
  string local_1c0 [32];
  long local_1a0 [2];
  ostream local_190 [208];
  undefined1 auStack_c0 [168];
  
  *(undefined ***)this = &PTR__SignatureError_001f45a8;
  this->expected_ = expected;
  this->actual_ = actual;
  (this->error_)._M_dataplus._M_p = (pointer)&(this->error_).field_2;
  (this->error_)._M_string_length = 0;
  (this->error_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a0);
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  std::ios::fill();
  auStack_c0[lVar1] = 0x30;
  poVar3 = std::operator<<(local_190,"Expected signature 0x");
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = std::operator<<(poVar3,"got signature 0x");
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  *(undefined8 *)(poVar3 + *(long *)(lVar1 + -0x18) + 0x10) = 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->error_,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  return;
}

Assistant:

Zip::SignatureError::SignatureError(uint32_t expected, uint32_t actual)
  : expected_(expected), actual_(actual) {
  std::stringstream ss;
  ss.fill('0');
  ss << "Expected signature 0x"
     << std::hex << std::setw(8) << expected_ << ", "
     << "got signature 0x"
     << std::hex << std::setw(8) << actual_;
  error_ = ss.str();
}